

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTcSymBif::add_runtime_symbol(CTcSymBif *this,CVmRuntimeSymbols *symtab)

{
  vm_val_t *val_00;
  CVmRuntimeSymbols *in_RSI;
  long in_RDI;
  vm_val_t val;
  size_t in_stack_ffffffffffffffe0;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffe8;
  
  vm_val_t::set_bifptr
            ((vm_val_t *)&stack0xffffffffffffffe0,*(ushort *)(in_RDI + 0x28),
             *(ushort *)(in_RDI + 0x2a));
  val_00 = (vm_val_t *)CTcSymbolBase::get_sym((CTcSymbolBase *)0x2d935f);
  CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x2d936d);
  CVmRuntimeSymbols::add_sym
            (in_RSI,(char *)in_stack_ffffffffffffffe8.ptr,in_stack_ffffffffffffffe0,val_00);
  return;
}

Assistant:

void CTcSymBif::add_runtime_symbol(CVmRuntimeSymbols *symtab)
{
    vm_val_t val;

    /* add an entry for our absolute address */
    val.set_bifptr(func_set_id_, func_idx_);
    symtab->add_sym(get_sym(), get_sym_len(), &val);
}